

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

void __thiscall xLearn::Solver::Initialize(Solver *this,int argc,char **argv)

{
  byte *in_RDI;
  char **in_stack_00000030;
  int in_stack_0000003c;
  Solver *in_stack_00000040;
  Solver *in_stack_00000070;
  Solver *in_stack_00000680;
  Solver *in_stack_00000a70;
  
  print_logo(in_stack_00000040);
  checker(in_stack_00000040,in_stack_0000003c,in_stack_00000030);
  init_log(in_stack_00000070);
  if ((*in_RDI & 1) == 0) {
    init_predict(in_stack_00000680);
  }
  else {
    init_train(in_stack_00000a70);
  }
  return;
}

Assistant:

void Solver::Initialize(int argc, char* argv[]) {
  //  Print logo
  print_logo();
  // Check and parse command line arguments
  checker(argc, argv);
  // Initialize log file
  init_log();
  // Init train or predict
  if (hyper_param_.is_train) {
    init_train();
  } else {
    init_predict();
  }
}